

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O3

bool __thiscall
axl::sl::
Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>>
::
setCountImpl<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>::Construct>
          (Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,bool>,axl::sl::HashTableEntry<unsigned_long,bool>::GetBucketLink>>>
           *this,size_t count)

{
  int *piVar1;
  RefCount *__s;
  ulong uVar2;
  undefined8 uVar3;
  void *pvVar4;
  FreeFunc *pFVar5;
  size_t sVar6;
  EVP_PKEY_CTX *dst;
  ulong uVar7;
  RefCount *pRVar8;
  undefined1 *puVar9;
  void *pvVar10;
  undefined8 *puVar11;
  Hdr *pHVar12;
  long lVar13;
  Hdr *pHVar14;
  void *pvVar15;
  long lVar16;
  bool bVar17;
  Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>::Hdr>
  hdr;
  Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>::Hdr>
  local_38;
  
  uVar7 = count * 0x18;
  lVar16 = *(long *)(this + 8);
  if ((lVar16 != 0) && (*(int *)(lVar16 + 0x10) == 1)) {
    uVar2 = *(ulong *)(this + 0x10);
    if (count == uVar2) {
      return true;
    }
    if (uVar7 <= *(ulong *)(lVar16 + 0x18)) {
      lVar13 = count - uVar2;
      if ((uVar2 <= count && lVar13 != 0) && (0 < lVar13)) {
        pvVar4 = (void *)(*(long *)this + uVar2 * 0x18);
        pvVar15 = (void *)((long)pvVar4 + lVar13 * 0x18);
        pvVar10 = (void *)(*(long *)this + uVar2 * 0x18 + 0x18);
        if (pvVar10 < pvVar15) {
          pvVar10 = pvVar15;
        }
        lVar16 = (long)pvVar10 + (-0x18 - (long)pvVar4);
        uVar7 = (ulong)(lVar16 != 0);
        memset(pvVar4,0,((lVar16 - uVar7) / 0x18 + uVar7) * 0x18 + 0x18);
        lVar16 = *(long *)(this + 8);
      }
      *(size_t *)(lVar16 + 0x28) = count;
      *(size_t *)(this + 0x10) = count;
      return true;
    }
  }
  if (count == 0) {
    ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
    ::release((ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
               *)this);
  }
  else {
    if (*(long *)(this + 0x10) != 0) {
      sVar6 = getAllocSize<4096ul>(uVar7);
      dst = (EVP_PKEY_CTX *)operator_new(sVar6 + 0x30,(nothrow_t *)&std::nothrow);
      *(undefined4 *)(dst + 0x10) = 0;
      *(undefined4 *)(dst + 0x14) = 1;
      *(size_t *)(dst + 0x18) = sVar6;
      *(undefined8 *)(dst + 0x20) = 0;
      *(undefined ***)dst = &PTR__Hdr_0019db38;
      *(code **)(dst + 8) = mem::deallocate;
      local_38.m_p = (Hdr *)0x0;
      local_38.m_refCount = (RefCount *)0x0;
      rc::
      Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>::Hdr>
      ::copy(&local_38,dst,dst);
      bVar17 = local_38.m_p != (Hdr *)0x0;
      if (bVar17) {
        (local_38.m_p)->m_count = count;
        pHVar14 = local_38.m_p + 1;
        uVar7 = *(ulong *)(this + 0x10);
        if (uVar7 < count) {
          if (0 < (long)uVar7) {
            puVar11 = *(undefined8 **)this;
            pHVar12 = pHVar14;
            do {
              uVar3 = puVar11[2];
              (pHVar12->super_BufHdr).super_RefCount.m_refCount = (int)uVar3;
              (pHVar12->super_BufHdr).super_RefCount.m_weakRefCount = (int)((ulong)uVar3 >> 0x20);
              pFVar5 = (FreeFunc *)puVar11[1];
              (pHVar12->super_BufHdr).super_RefCount._vptr_RefCount = (_func_int **)*puVar11;
              (pHVar12->super_BufHdr).super_RefCount.m_freeFunc = pFVar5;
              pHVar12 = (Hdr *)&(pHVar12->super_BufHdr).m_bufferSize;
              puVar11 = puVar11 + 3;
            } while (pHVar12 < &(pHVar14->super_BufHdr).super_RefCount + uVar7);
            uVar7 = *(ulong *)(this + 0x10);
          }
          if (0 < (long)(count - uVar7)) {
            __s = &(pHVar14->super_BufHdr).super_RefCount + uVar7;
            pRVar8 = (RefCount *)(&(pHVar14->super_BufHdr).m_bufferSize + uVar7 * 3);
            if (pRVar8 < __s + (count - uVar7)) {
              pRVar8 = __s + (count - uVar7);
            }
            puVar9 = (undefined1 *)((long)pRVar8 + (-0x18 - (long)__s));
            uVar7 = (ulong)(puVar9 != (undefined1 *)0x0);
            memset(__s,0,(((long)puVar9 - uVar7) / 0x18 + uVar7) * 0x18 + 0x18);
          }
        }
        else if (0 < (long)count) {
          puVar11 = *(undefined8 **)this;
          pHVar12 = pHVar14;
          do {
            uVar3 = puVar11[2];
            (pHVar12->super_BufHdr).super_RefCount.m_refCount = (int)uVar3;
            (pHVar12->super_BufHdr).super_RefCount.m_weakRefCount = (int)((ulong)uVar3 >> 0x20);
            pFVar5 = (FreeFunc *)puVar11[1];
            (pHVar12->super_BufHdr).super_RefCount._vptr_RefCount = (_func_int **)*puVar11;
            (pHVar12->super_BufHdr).super_RefCount.m_freeFunc = pFVar5;
            pHVar12 = (Hdr *)&(pHVar12->super_BufHdr).m_bufferSize;
            puVar11 = puVar11 + 3;
          } while (pHVar12 < &(pHVar14->super_BufHdr).super_RefCount + count);
        }
        puVar11 = *(undefined8 **)(this + 8);
        LOCK();
        piVar1 = (int *)(puVar11 + 2);
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          (**(code **)*puVar11)(puVar11);
          LOCK();
          piVar1 = (int *)((long)puVar11 + 0x14);
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) && ((code *)puVar11[1] != (code *)0x0)) {
            (*(code *)puVar11[1])(puVar11);
          }
        }
        pHVar12 = local_38.m_p;
        *(Hdr **)this = pHVar14;
        local_38.m_p = (Hdr *)0x0;
        local_38.m_refCount = (RefCount *)0x0;
        *(Hdr **)(this + 8) = pHVar12;
        *(size_t *)(this + 0x10) = count;
      }
      rc::
      Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>::Hdr>
      ::clear(&local_38);
      return bVar17;
    }
    bVar17 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
             ::reserve((Array<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
                        *)this,count);
    if (!bVar17) {
      return false;
    }
    if (0 < (long)count) {
      pvVar4 = *(void **)this;
      pvVar15 = (void *)(uVar7 + (long)pvVar4);
      if ((void *)(uVar7 + (long)pvVar4) <= (void *)((long)pvVar4 + 0x18U)) {
        pvVar15 = (void *)((long)pvVar4 + 0x18U);
      }
      lVar16 = (long)pvVar15 + (-0x18 - (long)pvVar4);
      uVar7 = (ulong)(lVar16 != 0);
      memset(pvVar4,0,((lVar16 - uVar7) / 0x18 + uVar7) * 0x18 + 0x18);
    }
    *(size_t *)(*(long *)(this + 8) + 0x28) = count;
    *(size_t *)(this + 0x10) = count;
  }
  return true;
}

Assistant:

bool
	setCountImpl(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1) {
			if (this->m_count == count)
				return true;

			if (this->m_hdr->m_bufferSize >= size) {
				if (count > this->m_count)
					Construct() (this->m_p + this->m_count, count - this->m_count);
				else
					Details::destruct(this->m_p + count, this->m_count - count);

				Details::setHdrCount(this->m_hdr, count);
				this->m_count = count;
				return true;
			}
		}

		if (count == 0) {
			this->release();
			return true;
		}

		if (!this->m_count) {
			bool result = reserve(count);
			if (!result)
				return false;

			Construct() (this->m_p, count);
			Details::setHdrCount(this->m_hdr, count);
			this->m_count = count;
			return true;
		}

		ASSERT(this->m_hdr);

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, count);

		T* p = (T*)(hdr + 1);

		if (count <= this->m_count) {
			Details::constructCopy(p, this->m_p, count);
		} else {
			Details::constructCopy(p, this->m_p, this->m_count);
			Construct() (p + this->m_count, count - this->m_count);
		}

		this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		this->m_count = count;
		return true;
	}